

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O1

char * luaL_optlstring(lua_State *L,int idx,char *def,size_t *len)

{
  uint uVar1;
  TValue *pTVar2;
  size_t sVar3;
  ulong uVar4;
  GCstr *pGVar5;
  
  pTVar2 = index2adr(L,idx);
  uVar1 = (pTVar2->field_2).it;
  if (uVar1 == 0xfffffffb) {
    pGVar5 = (GCstr *)(ulong)(pTVar2->u32).lo;
  }
  else {
    if (uVar1 == 0xffffffff) {
      if (len == (size_t *)0x0) {
        return def;
      }
      if (def == (char *)0x0) {
        sVar3 = 0;
      }
      else {
        sVar3 = strlen(def);
      }
      *len = sVar3;
      return def;
    }
    if (0xfffeffff < uVar1) {
      lj_err_argt(L,idx,4);
    }
    uVar4 = (ulong)(L->glref).ptr32;
    if (*(uint *)(uVar4 + 0x54) <= *(uint *)(uVar4 + 0x50)) {
      lj_gc_step(L);
    }
    pTVar2 = index2adr(L,idx);
    pGVar5 = lj_strfmt_number(L,pTVar2);
    (pTVar2->u32).lo = (uint32_t)pGVar5;
    (pTVar2->field_2).it = 0xfffffffb;
  }
  if (len != (size_t *)0x0) {
    *len = (ulong)pGVar5->len;
  }
  return (char *)(pGVar5 + 1);
}

Assistant:

LUALIB_API const char *luaL_optlstring(lua_State *L, int idx,
				       const char *def, size_t *len)
{
  TValue *o = index2adr(L, idx);
  GCstr *s;
  if (LJ_LIKELY(tvisstr(o))) {
    s = strV(o);
  } else if (tvisnil(o)) {
    if (len != NULL) *len = def ? strlen(def) : 0;
    return def;
  } else if (tvisnumber(o)) {
    lj_gc_check(L);
    o = index2adr(L, idx);  /* GC may move the stack. */
    s = lj_strfmt_number(L, o);
    setstrV(L, o, s);
  } else {
    lj_err_argt(L, idx, LUA_TSTRING);
  }
  if (len != NULL) *len = s->len;
  return strdata(s);
}